

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

bool dxil_spv::emit_create_handle_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  CallInst *impl_00;
  bool bVar2;
  Value *instruction_offset;
  uint32_t local_3c;
  uint uStack_38;
  ResourceType resource_type;
  uint32_t non_uniform;
  uint32_t resource_range;
  uint32_t resource_type_operand;
  _Node_iterator_base<const_LLVMBC::CallInst_*,_false> local_28;
  CallInst *local_20;
  CallInst *instruction_local;
  Impl *impl_local;
  
  local_20 = instruction;
  instruction_local = (CallInst *)impl;
  bVar2 = resource_handle_needs_sink(impl,instruction);
  if (bVar2) {
    pCVar1 = instruction_local + 0x1b;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_set<const_LLVMBC::CallInst_*,_std::hash<const_LLVMBC::CallInst_*>,_std::equal_to<const_LLVMBC::CallInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>_>
         ::find((unordered_set<const_LLVMBC::CallInst_*,_std::hash<const_LLVMBC::CallInst_*>,_std::equal_to<const_LLVMBC::CallInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>_>
                 *)&instruction_local[0x1b].super_Instruction.operands,&local_20);
    std::
    unordered_set<const_LLVMBC::CallInst_*,_std::hash<const_LLVMBC::CallInst_*>,_std::equal_to<const_LLVMBC::CallInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>_>
    ::erase((unordered_set<const_LLVMBC::CallInst_*,_std::hash<const_LLVMBC::CallInst_*>,_std::equal_to<const_LLVMBC::CallInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>_>
             *)&(pCVar1->super_Instruction).operands,(iterator)local_28._M_cur);
    impl_local._7_1_ = true;
  }
  else {
    bVar2 = get_constant_operand(&local_20->super_Instruction,1,&non_uniform);
    if (bVar2) {
      bVar2 = get_constant_operand(&local_20->super_Instruction,2,&stack0xffffffffffffffc8);
      if (bVar2) {
        local_3c = 0;
        get_constant_operand(&local_20->super_Instruction,4,&local_3c);
        impl_00 = instruction_local;
        pCVar1 = local_20;
        instruction_offset = LLVMBC::Instruction::getOperand(&local_20->super_Instruction,3);
        impl_local._7_1_ =
             emit_create_handle((Impl *)impl_00,pCVar1,(ResourceType)non_uniform,uStack_38,
                                instruction_offset,local_3c != 0);
      }
      else {
        impl_local._7_1_ = false;
      }
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_create_handle_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (resource_handle_needs_sink(impl, instruction))
	{
		impl.resource_handles_needing_sink.erase(impl.resource_handles_needing_sink.find(instruction));
		return true;
	}

	uint32_t resource_type_operand, resource_range;

	if (!get_constant_operand(instruction, 1, &resource_type_operand))
		return false;
	if (!get_constant_operand(instruction, 2, &resource_range))
		return false;

	uint32_t non_uniform = 0;
	get_constant_operand(instruction, 4, &non_uniform);

	auto resource_type = static_cast<DXIL::ResourceType>(resource_type_operand);
	return emit_create_handle(impl, instruction, resource_type, resource_range,
	                          instruction->getOperand(3), non_uniform != 0);
}